

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.hpp
# Opt level: O0

void HAXX::
     TPACK<2ul,HAXX::quaternion<double>,HAXX::GenericPackOps_T1<HAXX::quaternion<double>,HAXX::AVXType<double>>,std::complex<double>>
               (int32_t M,int32_t N,quaternion<double> *X,int32_t LDX,quaternion<double> *Xp,
               complex<double> args)

{
  int iVar1;
  uint in_ESI;
  tuple<HAXX::quaternion<double>_*> xCol_1;
  tuple<HAXX::quaternion<double>_*,_HAXX::quaternion<double>_*> xCol;
  anon_class_40_5_4bfda206 loopBody;
  anon_class_1_0_00000001 store;
  anon_class_1_0_00000001 ptrInc;
  type load_preOP;
  complex_t alpha;
  quaternion<double> *_xp;
  quaternion<double> *_x2;
  quaternion<double> *_x1;
  quaternion<double> *_x;
  int32_t j;
  int32_t i;
  size_t NLOAD;
  quaternion<double> **in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  type_conflict1 in_stack_fffffffffffffeb0;
  anon_class_8_1_a7a3a07e in_stack_fffffffffffffeb8;
  complex<double> *in_stack_ffffffffffffff30;
  quaternion<double> **in_stack_ffffffffffffff50;
  tuple<HAXX::quaternion<double>_*,_HAXX::quaternion<double>_*> *in_stack_ffffffffffffff58;
  anon_class_40_5_4bfda206 *in_stack_ffffffffffffff60;
  
  AVXType<double>::LoadScalar(in_stack_ffffffffffffff30);
  overload<HAXX::TPACK<2ul,HAXX::quaternion<double>,HAXX::GenericPackOps_T1<HAXX::quaternion<double>,HAXX::AVXType<double>>,std::complex<double>>(int,int,HAXX::quaternion<double>*,int,HAXX::quaternion<double>*,std::complex<double>)::_lambda(auto:1&)_1_,HAXX::TPACK<2ul,HAXX::quaternion<double>,HAXX::GenericPackOps_T1<HAXX::quaternion<double>,HAXX::AVXType<double>>,std::complex<double>>(int,int,HAXX::quaternion<double>*,int,HAXX::quaternion<double>*,std::complex<double>)::_lambda()_1_>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  for (iVar1 = (int)((ulong)(long)(int)in_ESI >> 1); 0 < iVar1; iVar1 = iVar1 + -1) {
    pointer_sequence<2ul,HAXX::quaternion<double>*>
              ((quaternion<double> *)in_stack_fffffffffffffeb0.alpha,in_stack_fffffffffffffea8);
    TPACK<2ul,HAXX::quaternion<double>,HAXX::GenericPackOps_T1<HAXX::quaternion<double>,HAXX::AVXType<double>>,std::complex<double>>(int,int,HAXX::quaternion<double>*,int,HAXX::quaternion<double>*,std::complex<double>)
    ::{lambda(auto:1&,auto:2*&)#1}::operator()
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  if ((in_ESI & 1) != 0) {
    if ((in_ESI & 1) != 1) {
      __assert_fail("j == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/include/hblas/pack/pack.hpp"
                    ,0x77,
                    "void HAXX::TPACK(const int32_t, const int32_t, T *, const int32_t, T *, Args...) [PK = 2UL, T = HAXX::quaternion<double>, PackOps = HAXX::GenericPackOps_T1<quaternion<double>, AVXType<double>>, Args = <std::complex<double>>]"
                   );
    }
    std::make_tuple<HAXX::quaternion<double>*&>(in_stack_fffffffffffffea0);
    TPACK<2ul,HAXX::quaternion<double>,HAXX::GenericPackOps_T1<HAXX::quaternion<double>,HAXX::AVXType<double>>,std::complex<double>>(int,int,HAXX::quaternion<double>*,int,HAXX::quaternion<double>*,std::complex<double>)
    ::{lambda(auto:1&,auto:2*&)#1}::operator()
              (in_stack_ffffffffffffff60,
               (tuple<HAXX::quaternion<double>_*> *)in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

void TPACK(const HAXX_INT M, const HAXX_INT N, T *X,
    const HAXX_INT LDX, T *Xp, Args... args) {
  
  
    // Sanity Checks
      

    static_assert( PK > 0, "Packing dimension must be non-zero" );      

    static_assert(
      (sizeof(typename PackOps::load_t) % sizeof(T)) == 0,
      "The size of the loaded variable must be an integer multiple of T" 
    );

    constexpr size_t NLOAD = sizeof(typename PackOps::load_t) / sizeof(T);

    static_assert(
      ( PK % NLOAD ) == 0,
      "The packing dimension must be an integer multiple of NLOAD"
    );

  
  
    HAXX_INT i,j;
  
  
    T *_x,*_x1,*_x2;
    T *_xp;
    
  
    _x  = X;
    _xp = Xp;
  
    auto alpha = PackOps::TypeWrapper::LoadScalar(args...);
  
  
    auto load_preOP = 
      overload(
        [&](auto &t){ 
          auto x = PackOps::TypeWrapper::Load(t);        
          return PackOps::preOP(x,alpha);
        },
        [&](){ 
          auto x = PackOps::TypeWrapper::Load();        
          return PackOps::preOP(x,alpha);
        }
      );
  
    auto ptrInc = [](auto &t){ return t + 1; };
  
    auto store = [](auto *&p, auto &t){ PackOps::TypeWrapper::Store(p,t);    };

    auto loopBody = [&](auto &xCol, auto *&xp) {

      for( i = 0; i < M; i++ ) {
  
        auto x   = apply_n<PK>( load_preOP, xCol );
        auto x_t = PackOps::OP(x);
  
        array_tuple_execute( store, xp, x_t );
  
        xCol = apply( ptrInc, xCol );
        xp += PK;
  
      }

    };
  
    j = N / PK;
    if( j > 0 )
    do {
  
      auto xCol = pointer_sequence<PK>(_x,LDX);
      _x += PK*LDX;

      loopBody(xCol,_xp);
      
      j--;
  
    } while(j > 0);
  

    j = N % PK;
    if( j ) {
  
      #ifdef _NDEBUG
        #undef _NDEBUG
        assert(j == 1 /* This has yet to be worked out */);
        #define _NDEBUG
      #else
        assert(j == 1 /* This has yet to be worked out */);
      #endif
  
      auto xCol = std::make_tuple(_x);
      loopBody(xCol,_xp);

    }
  
  }